

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall
ot::commissioner::Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator
          (NetworkSelectionComparator *this)

{
  char *pcVar1;
  Status SVar2;
  char *pcVar3;
  Network nwk;
  string local_88;
  Network local_68;
  
  if (this->mSuccess == true) {
    persistent_storage::Network::Network(&local_68);
    SVar2 = persistent_storage::Registry::GetCurrentNetwork
                      ((this->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,&local_68);
    if ((SVar2 == kSuccess) && (this->mStartWith != local_68.mXpan)) {
      pcVar3 = "Network selection was changed by the command";
      if (local_68.mXpan == 0) {
        pcVar3 = "Network selection was dropped by the command";
      }
      pcVar1 = "Network selection was changed by the command";
      if (local_68.mXpan == 0) {
        pcVar1 = "Network selection was dropped by the command";
      }
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,pcVar3,pcVar1 + 0x2c);
      Console::Write(&local_88,kYellow);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.mMlp._M_dataplus._M_p != &local_68.mMlp.field_2) {
      operator_delete(local_68.mMlp._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68.mName._M_dataplus._M_p != &local_68.mName.field_2) {
      operator_delete(local_68.mName._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

Interpreter::NetworkSelectionComparator::~NetworkSelectionComparator()
{
    if (mSuccess)
    {
        Network        nwk;
        RegistryStatus status = mInterpreter.mRegistry->GetCurrentNetwork(nwk);

        if (status == RegistryStatus::kSuccess && mStartWith != nwk.mXpan)
        {
            Console::Write(nwk.mXpan == 0 ? WARN_NETWORK_SELECTION_DROPPED : WARN_NETWORK_SELECTION_CHANGED,
                           Console::Color::kYellow);
        }
    }
}